

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleString_copyInBufferWithBiggerBufferThanNeeded_Test::testBody
          (TEST_SimpleString_copyInBufferWithBiggerBufferThanNeeded_Test *this)

{
  char *bufferToCopy;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString str;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_28,"Hello");
  bufferToCopy = (char *)(*PlatformSpecificMalloc)(0x14);
  SimpleString::copyToBuffer(&local_28,bufferToCopy,0x14);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString(&local_28);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,pcVar2,bufferToCopy,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x233,pTVar3);
  (*PlatformSpecificFree)(bufferToCopy);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

TEST(SimpleString, copyInBufferWithBiggerBufferThanNeeded)
{
    SimpleString str("Hello");
    size_t bufferSize = 20;
    char* buffer= (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);
    STRCMP_EQUAL(str.asCharString(), buffer);
    PlatformSpecificFree(buffer);
}